

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int divbwt(uchar *T,uchar *U,int *A,int n,uchar *num_indexes,int *indexes,int openMP)

{
  int iVar1;
  uint *SA;
  int *piVar2;
  int *bucket_B;
  byte bVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  byte bVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  
  if (n < 0 || (U == (uchar *)0x0 || T == (uchar *)0x0)) {
    iVar1 = -1;
  }
  else if ((uint)n < 2) {
    iVar1 = 0;
    if (n == 1) {
      *U = *T;
      iVar1 = 1;
    }
  }
  else {
    uVar5 = (ulong)(uint)n;
    piVar2 = indexes;
    SA = (uint *)A;
    if (A == (int *)0x0) {
      SA = (uint *)malloc(uVar5 * 4 + 4);
    }
    iVar1 = (int)piVar2;
    piVar2 = (int *)malloc(0x400);
    bucket_B = (int *)malloc(0x40000);
    if (bucket_B == (int *)0x0 || (piVar2 == (int *)0x0 || SA == (uint *)0x0)) {
      iVar1 = -2;
    }
    else {
      iVar1 = sort_typeBstar(T,(int *)SA,piVar2,bucket_B,n,iVar1);
      puVar10 = SA;
      if (num_indexes == (uchar *)0x0 || indexes == (int *)0x0) {
        if (0 < iVar1) {
          for (uVar21 = 0xfe; -1 < (int)uVar21; uVar21 = uVar21 - 1) {
            uVar6 = uVar21 << 8;
            iVar1 = bucket_B[(int)(uVar21 + 1 | uVar6)];
            puVar9 = SA + piVar2[(ulong)uVar21 + 1];
            puVar4 = (uint *)0x0;
            uVar12 = 0xffffffffffffffff;
            while (puVar9 = puVar9 + -1, SA + iVar1 <= puVar9) {
              uVar7 = *puVar9;
              uVar14 = (ulong)uVar7;
              if ((int)uVar7 < 1) {
                if (uVar14 == 0) {
                  if (uVar21 != *T) {
                    __assert_fail("T[s] == c1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xbb6a,
                                  "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                                 );
                  }
                }
                else {
                  *puVar9 = ~uVar7;
                }
              }
              else {
                bVar3 = T[uVar14];
                if (uVar21 != bVar3) {
                  __assert_fail("T[s] == c1",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xbb5a,
                                "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                               );
                }
                if ((n <= (int)(uVar14 + 1)) || (T[uVar14 + 1] < bVar3)) {
                  __assert_fail("((s + 1) < n) && (T[s] <= T[s + 1])",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xbb5b,
                                "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                               );
                }
                if (bVar3 < T[uVar14 - 1]) {
                  __assert_fail("T[s - 1] <= T[s]",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xbb5c,
                                "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                               );
                }
                bVar3 = T[uVar7 - 1];
                *puVar9 = ~(uint)bVar3;
                uVar19 = 0;
                if ((uVar14 != 1) && (uVar19 = uVar7 - 1, bVar3 < T[uVar14 - 2])) {
                  uVar19 = -uVar7;
                }
                uVar7 = (uint)uVar12;
                if (uVar7 == bVar3) {
                  uVar12 = uVar12 & 0xffffffff;
                }
                else {
                  if (-1 < (int)uVar7) {
                    bucket_B[(int)(uVar7 | uVar6)] = (int)((ulong)((long)puVar4 - (long)SA) >> 2);
                  }
                  puVar4 = SA + bucket_B[(long)(int)uVar6 | (ulong)bVar3];
                  uVar12 = (ulong)bVar3;
                }
                if (puVar9 <= puVar4) {
                  pcVar16 = "k < j";
LAB_001b0214:
                  __assert_fail(pcVar16,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xbb64,
                                "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                               );
                }
                if (puVar4 == (uint *)0x0) {
                  pcVar16 = "k != NULL";
                  goto LAB_001b0214;
                }
                *puVar4 = uVar19;
                puVar4 = puVar4 + -1;
              }
            }
          }
        }
        uVar12 = (ulong)T[n - 1U];
        uVar21 = ~(uint)T[uVar5 - 2];
        if (T[n - 1U] <= T[uVar5 - 2]) {
          uVar21 = n - 1U;
        }
        puVar9 = SA + (long)piVar2[uVar12] + 1;
        puVar9[-1] = uVar21;
        for (puVar4 = SA; puVar4 < SA + uVar5; puVar4 = puVar4 + 1) {
          uVar21 = *puVar4;
          lVar18 = (long)(int)uVar21;
          if (lVar18 < 1) {
            puVar11 = puVar4;
            if (uVar21 != 0) {
              *puVar4 = ~uVar21;
              puVar11 = puVar10;
            }
          }
          else {
            if (T[lVar18 + -1] < T[lVar18]) {
              __assert_fail("T[s - 1] >= T[s]",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xbb78,
                            "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                           );
            }
            bVar3 = T[uVar21 - 1];
            *puVar4 = (uint)bVar3;
            uVar6 = 0;
            if ((uVar21 != 1) && (uVar6 = uVar21 - 1, T[lVar18 + -2] < bVar3)) {
              uVar6 = ~(uint)T[lVar18 + -2];
            }
            if ((uint)uVar12 != (uint)bVar3) {
              piVar2[uVar12] = (int)((ulong)((long)puVar9 - (long)SA) >> 2);
              puVar9 = SA + piVar2[bVar3];
              uVar12 = (ulong)bVar3;
            }
            if (puVar9 <= puVar4) {
              __assert_fail("i < k",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,48000,
                            "int construct_BWT(const unsigned char *, int *, int *, int *, int, int)"
                           );
            }
            *puVar9 = uVar6;
            puVar9 = puVar9 + 1;
            puVar11 = puVar10;
          }
          puVar10 = puVar11;
        }
      }
      else {
        uVar21 = (uint)n >> 4 | (uint)n >> 3;
        uVar21 = uVar21 >> 2 | uVar21;
        uVar21 = uVar21 >> 4 | uVar21;
        uVar21 = uVar21 >> 8 | uVar21;
        uVar7 = uVar21 >> 1 | uVar21 >> 0x11;
        uVar21 = n - 1;
        uVar6 = uVar7 + 1;
        *num_indexes = (uchar)((ulong)uVar21 / (ulong)uVar6);
        if (0 < iVar1) {
          uVar19 = 0xfe;
LAB_001afccf:
          if (-1 < (int)uVar19) {
            uVar13 = uVar19 << 8;
            iVar1 = bucket_B[(int)(uVar19 + 1 | uVar13)];
            puVar9 = SA + piVar2[(ulong)uVar19 + 1];
            puVar4 = (uint *)0x0;
            uVar12 = 0xffffffffffffffff;
            while( true ) {
              uVar14 = (-4 - (long)SA) + (long)puVar9;
              while( true ) {
                puVar9 = puVar9 + -1;
                if (puVar9 < SA + iVar1) {
                  uVar19 = uVar19 - 1;
                  goto LAB_001afccf;
                }
                uVar20 = *puVar9;
                uVar15 = (ulong)uVar20;
                if (0 < (int)uVar20) break;
                if (uVar15 == 0) {
                  if (uVar19 != *T) {
                    __assert_fail("T[s] == c1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xbbbe,
                                  "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                                 );
                  }
                }
                else {
                  *puVar9 = ~uVar20;
                }
                uVar14 = uVar14 - 4;
              }
              bVar3 = T[uVar15];
              if (uVar19 != bVar3) {
                __assert_fail("T[s] == c1",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbbab,
                              "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                             );
              }
              if ((n <= (int)(uVar15 + 1)) || (T[uVar15 + 1] < bVar3)) {
                __assert_fail("((s + 1) < n) && (T[s] <= T[s + 1])",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbbac,
                              "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                             );
              }
              if (bVar3 < T[uVar15 - 1]) {
                __assert_fail("T[s - 1] <= T[s]",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xbbad,
                              "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                             );
              }
              if ((uVar7 & uVar20) == 0) {
                indexes[(ulong)uVar20 / (ulong)uVar6 - 1] = (int)(uVar14 >> 2);
              }
              bVar3 = T[uVar20 - 1];
              uVar14 = (ulong)bVar3;
              *puVar9 = ~(uint)bVar3;
              uVar8 = 0;
              if ((uVar20 != 1) && (uVar8 = uVar20 - 1, bVar3 < T[uVar15 - 2])) {
                uVar8 = -uVar20;
              }
              uVar20 = (uint)uVar12;
              if (uVar20 == bVar3) {
                uVar14 = uVar12 & 0xffffffff;
              }
              else {
                if (-1 < (int)uVar20) {
                  bucket_B[(int)(uVar20 | uVar13)] = (int)((ulong)((long)puVar4 - (long)SA) >> 2);
                }
                puVar4 = SA + bucket_B[(long)(int)uVar13 | uVar14];
              }
              if (puVar9 <= puVar4) break;
              if (puVar4 == (uint *)0x0) {
                pcVar16 = "k != NULL";
                goto LAB_001b01ae;
              }
              *puVar4 = uVar8;
              puVar4 = puVar4 + -1;
              uVar12 = uVar14;
            }
            pcVar16 = "k < j";
LAB_001b01ae:
            __assert_fail(pcVar16,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xbbb8,
                          "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                         );
          }
        }
        uVar12 = (ulong)T[uVar21];
        iVar1 = piVar2[uVar12];
        bVar3 = T[uVar5 - 2];
        if (bVar3 < T[uVar21]) {
          if ((uVar7 & uVar21) == 0) {
            indexes[(long)(int)((ulong)uVar21 / (ulong)uVar6) + -1] = iVar1;
            bVar3 = T[uVar5 - 2];
          }
          uVar21 = ~(uint)bVar3;
        }
        SA[iVar1] = uVar21;
        puVar9 = SA + iVar1 + 1;
        iVar1 = 0;
        for (puVar4 = SA; puVar4 < SA + uVar5; puVar4 = puVar4 + 1) {
          uVar21 = *puVar4;
          lVar18 = (long)(int)uVar21;
          if (lVar18 < 1) {
            puVar11 = puVar4;
            if (uVar21 != 0) {
              *puVar4 = ~uVar21;
              puVar11 = puVar10;
            }
          }
          else {
            if (T[lVar18 + -1] < T[lVar18]) {
              __assert_fail("T[s - 1] >= T[s]",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xbbd3,
                            "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                           );
            }
            if ((uVar7 & uVar21) == 0) {
              indexes[(ulong)uVar21 / (ulong)uVar6 - 1] = iVar1;
            }
            uVar19 = uVar21 - 1;
            bVar3 = T[uVar19];
            *puVar4 = (uint)bVar3;
            if ((uint)uVar12 != (uint)bVar3) {
              piVar2[uVar12] = (int)((ulong)((long)puVar9 - (long)SA) >> 2);
              puVar9 = SA + piVar2[bVar3];
              uVar12 = (ulong)bVar3;
            }
            if (puVar9 <= puVar4) {
              __assert_fail("i < k",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xbbdd,
                            "int construct_BWT_indexes(const unsigned char *, int *, int *, int *, int, int, unsigned char *, int *)"
                           );
            }
            if ((uVar21 == 1) || (bVar17 = T[lVar18 + -2], bVar3 <= bVar17)) {
              *puVar9 = uVar19;
            }
            else {
              if ((uVar7 & uVar19) == 0) {
                indexes[(ulong)uVar19 / (ulong)uVar6 - 1] =
                     (int)((ulong)((long)puVar9 - (long)SA) >> 2);
                bVar17 = T[lVar18 + -2];
              }
              *puVar9 = ~(uint)bVar17;
            }
            puVar9 = puVar9 + 1;
            puVar11 = puVar10;
          }
          iVar1 = iVar1 + 1;
          puVar10 = puVar11;
        }
      }
      uVar12 = (ulong)((long)puVar10 - (long)SA) >> 2;
      *U = T[uVar5 - 1];
      uVar5 = 0;
      iVar1 = (int)uVar12;
      uVar14 = 0;
      if (0 < iVar1) {
        uVar14 = uVar12 & 0xffffffff;
      }
      for (; uVar14 != uVar5; uVar5 = uVar5 + 1) {
        U[uVar5 + 1] = (uchar)SA[uVar5];
      }
      for (; (int)uVar14 + 1 < n; uVar14 = uVar14 + 1) {
        U[uVar14 + 1] = (uchar)SA[uVar14 + 1];
      }
      iVar1 = iVar1 + 1;
    }
    free(bucket_B);
    free(piVar2);
    if (A == (int *)0x0) {
      free(SA);
    }
  }
  return iVar1;
}

Assistant:

int
divbwt(const unsigned char *T, unsigned char *U, int *A, int n, unsigned char * num_indexes, int * indexes, int openMP) {
  int *B;
  int *bucket_A, *bucket_B;
  int m, pidx, i;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0)) { return -1; }
  else if(n <= 1) { if(n == 1) { U[0] = T[0]; } return n; }

  if((B = A) == NULL) { B = (int *)malloc((size_t)(n + 1) * sizeof(int)); }
  bucket_A = (int *)malloc(BUCKET_A_SIZE * sizeof(int));
  bucket_B = (int *)malloc(BUCKET_B_SIZE * sizeof(int));

  /* Burrows-Wheeler Transform. */
  if((B != NULL) && (bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, B, bucket_A, bucket_B, n, openMP);

    if (num_indexes == NULL || indexes == NULL) {
        pidx = construct_BWT(T, B, bucket_A, bucket_B, n, m);
    } else {
        pidx = construct_BWT_indexes(T, B, bucket_A, bucket_B, n, m, num_indexes, indexes);
    }

    /* Copy to output string. */
    U[0] = T[n - 1];
    for(i = 0; i < pidx; ++i) { U[i + 1] = (unsigned char)B[i]; }
    for(i += 1; i < n; ++i) { U[i] = (unsigned char)B[i]; }
    pidx += 1;
  } else {
    pidx = -2;
  }

  free(bucket_B);
  free(bucket_A);
  if(A == NULL) { free(B); }

  return pidx;
}